

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Table * sqlite3LocateTableItem(Parse *pParse,u32 flags,SrcItem *p)

{
  Schema *pSVar1;
  Table *pTVar2;
  long lVar3;
  Db *pDVar4;
  Schema **ppSVar5;
  
  if (((p->fg).field_0x3 & 1) == 0) {
    pDVar4 = (Db *)&p->u4;
  }
  else {
    if ((p->u4).pSchema == (Schema *)0x0) {
      lVar3 = -0x8000;
    }
    else {
      lVar3 = -0x100000000;
      ppSVar5 = &pParse->db->aDb->pSchema;
      do {
        lVar3 = lVar3 + 0x100000000;
        pSVar1 = *ppSVar5;
        ppSVar5 = ppSVar5 + 4;
      } while (pSVar1 != (p->u4).pSchema);
      lVar3 = lVar3 >> 0x20;
    }
    pDVar4 = pParse->db->aDb + lVar3;
  }
  pTVar2 = sqlite3LocateTable(pParse,flags,p->zName,
                              ((anon_union_8_3_5f9225e5_for_u4 *)&pDVar4->zDbSName)->zDatabase);
  return pTVar2;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTableItem(
  Parse *pParse,
  u32 flags,
  SrcItem *p
){
  const char *zDb;
  if( p->fg.fixedSchema ){
    int iDb = sqlite3SchemaToIndex(pParse->db, p->u4.pSchema);
    zDb = pParse->db->aDb[iDb].zDbSName;
  }else{
    assert( !p->fg.isSubquery );
    zDb = p->u4.zDatabase;
  }
  return sqlite3LocateTable(pParse, flags, p->zName, zDb);
}